

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void Json::CharReaderBuilder::strictMode(Value *settings)

{
  Value *pVVar1;
  Value *key;
  Value *this;
  Value *in_stack_fffffffffffffe98;
  undefined1 value;
  Value *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  Value *in_stack_fffffffffffffeb0;
  Value *in_stack_fffffffffffffed0;
  
  Value::Value(in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  Value::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Value::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Value::~Value(in_stack_fffffffffffffed0);
  Value::Value(in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  Value::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Value::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Value::~Value(in_stack_fffffffffffffed0);
  Value::Value(in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  Value::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Value::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Value::~Value(in_stack_fffffffffffffed0);
  Value::Value(in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  pVVar1 = Value::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Value::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Value::~Value(in_stack_fffffffffffffed0);
  Value::Value(in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  key = Value::operator[](pVVar1,in_stack_fffffffffffffea8);
  Value::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Value::~Value(in_stack_fffffffffffffed0);
  Value::Value(in_stack_fffffffffffffea0,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x38,0));
  this = Value::operator[](pVVar1,(char *)key);
  Value::operator=(this,in_stack_fffffffffffffe98);
  value = (undefined1)((ulong)in_stack_fffffffffffffe98 >> 0x38);
  Value::~Value(in_stack_fffffffffffffed0);
  Value::Value(this,(bool)value);
  pVVar1 = Value::operator[](pVVar1,(char *)key);
  Value::operator=(this,pVVar1);
  Value::~Value(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void CharReaderBuilder::strictMode(Json::Value* settings)
{
//! [CharReaderBuilderStrictMode]
  (*settings)["allowComments"] = false;
  (*settings)["strictRoot"] = true;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = true;
//! [CharReaderBuilderStrictMode]
}